

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell::
~TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell
          (TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell *this)

{
  TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell *this_local;
  
  ~TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionCopier)
{
    MyTypeForTesting expectedObject(9874452);
    MyTypeForTesting actualObject(2034);
    MockFunctionCopier copier(myTypeCopy);
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);

    mock().checkExpectations();
    CHECK_EQUAL(9874452, *(expectedObject.value));
    CHECK_EQUAL(9874452, *(actualObject.value));

    mock().removeAllComparatorsAndCopiers();
}